

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

Wln_Ntk_t * Wln_NtkAlloc(char *pName,int nObjsMax)

{
  int iVar1;
  Wln_Ntk_t *pWVar2;
  Wln_Vec_t *pWVar3;
  Hash_IntMan_t *pHVar4;
  char *local_30;
  int local_24;
  int i;
  Wln_Ntk_t *p;
  int nObjsMax_local;
  char *pName_local;
  
  pWVar2 = (Wln_Ntk_t *)calloc(1,0x458);
  if (pName == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = Extra_FileNameGeneric(pName);
  }
  pWVar2->pName = local_30;
  Vec_IntGrow(&pWVar2->vCis,0x6f);
  Vec_IntGrow(&pWVar2->vCos,0x6f);
  Vec_IntGrow(&pWVar2->vFfs,0x6f);
  Vec_IntGrow(&pWVar2->vTypes,nObjsMax + 1);
  Vec_StrGrow(&pWVar2->vSigns,nObjsMax + 1);
  Vec_IntGrow(&pWVar2->vRanges,nObjsMax + 1);
  Vec_IntPush(&pWVar2->vTypes,-1);
  Vec_StrPush(&pWVar2->vSigns,-1);
  Vec_IntPush(&pWVar2->vRanges,-1);
  pWVar3 = (Wln_Vec_t *)calloc((long)(nObjsMax + 1),0x10);
  pWVar2->vFanins = pWVar3;
  pHVar4 = Hash_IntManStart(1000);
  pWVar2->pRanges = pHVar4;
  for (local_24 = 0; local_24 < 0x41; local_24 = local_24 + 1) {
    Hash_Int2ManInsert(pWVar2->pRanges,local_24,local_24,0);
  }
  for (local_24 = 1; local_24 < 0x40; local_24 = local_24 + 1) {
    Hash_Int2ManInsert(pWVar2->pRanges,local_24,0,0);
  }
  iVar1 = Hash_IntManEntryNum(pWVar2->pRanges);
  if (iVar1 == 0x80) {
    return pWVar2;
  }
  __assert_fail("Hash_IntManEntryNum(p->pRanges) == 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnNtk.c"
                ,0x41,"Wln_Ntk_t *Wln_NtkAlloc(char *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating networks.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Wln_Ntk_t * Wln_NtkAlloc( char * pName, int nObjsMax )
{
    Wln_Ntk_t * p; int i;
    p = ABC_CALLOC( Wln_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    Vec_IntGrow( &p->vTypes,  nObjsMax+1 );
    Vec_StrGrow( &p->vSigns,  nObjsMax+1 );
    Vec_IntGrow( &p->vRanges, nObjsMax+1 );
    Vec_IntPush( &p->vTypes,  -1 );
    Vec_StrPush( &p->vSigns,  -1 );
    Vec_IntPush( &p->vRanges, -1 );
    p->vFanins = ABC_CALLOC( Wln_Vec_t, nObjsMax+1 );
    p->pRanges = Hash_IntManStart( 1000 );
    for ( i = 0; i < 65; i++ )
        Hash_Int2ManInsert( p->pRanges, i, i, 0 );
    for ( i = 1; i < 64; i++ )
        Hash_Int2ManInsert( p->pRanges, i, 0, 0 );
    assert( Hash_IntManEntryNum(p->pRanges) == 128 );
    return p;
}